

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuBilinearImageCompare.cpp
# Opt level: O0

bool tcu::anon_unknown_0::comparePixelRGBA8
               (ConstPixelBufferAccess *reference,ConstPixelBufferAccess *result,RGBA threshold,
               int x,int y)

{
  bool bVar1;
  RGBA a;
  deUint32 dVar2;
  int iVar3;
  deUint32 dVar4;
  deUint32 y_00;
  deUint32 y_01;
  RGBA RVar5;
  int v;
  int u;
  int sampleNdx;
  deUint32 y2;
  deUint32 y1;
  deUint32 y0;
  deUint32 x2;
  deUint32 x1;
  deUint32 x0;
  RGBA resPix;
  int y_local;
  int x_local;
  ConstPixelBufferAccess *result_local;
  ConstPixelBufferAccess *reference_local;
  RGBA threshold_local;
  
  a = readRGBA8(result,x,y);
  dVar2 = de::max<int>(x + -1,0);
  iVar3 = ConstPixelBufferAccess::getWidth(reference);
  dVar4 = de::min<int>(x + 1,iVar3 + -1);
  y_00 = de::max<int>(y + -1,0);
  iVar3 = ConstPixelBufferAccess::getHeight(reference);
  y_01 = de::min<int>(y + 1,iVar3 + -1);
  RVar5 = readRGBA8(reference,x,y);
  bVar1 = compareThreshold(a,RVar5,threshold);
  if (!bVar1) {
    RVar5 = readRGBA8(reference,dVar2,y);
    bVar1 = compareThreshold(a,RVar5,threshold);
    if (!bVar1) {
      RVar5 = readRGBA8(reference,dVar4,y);
      bVar1 = compareThreshold(a,RVar5,threshold);
      if (!bVar1) {
        RVar5 = readRGBA8(reference,dVar2,y_00);
        bVar1 = compareThreshold(a,RVar5,threshold);
        if (!bVar1) {
          RVar5 = readRGBA8(reference,x,y_00);
          bVar1 = compareThreshold(a,RVar5,threshold);
          if (!bVar1) {
            RVar5 = readRGBA8(reference,dVar4,y_00);
            bVar1 = compareThreshold(a,RVar5,threshold);
            if (!bVar1) {
              RVar5 = readRGBA8(reference,dVar2,y_01);
              bVar1 = compareThreshold(a,RVar5,threshold);
              if (!bVar1) {
                RVar5 = readRGBA8(reference,x,y_01);
                bVar1 = compareThreshold(a,RVar5,threshold);
                if (!bVar1) {
                  RVar5 = readRGBA8(reference,dVar4,y_01);
                  bVar1 = compareThreshold(a,RVar5,threshold);
                  if (!bVar1) {
                    v = 0;
                    do {
                      if (0x1b < v) {
                        return false;
                      }
                      dVar2 = (x * 0x100 + comparePixelRGBA8::s_offsets[v][0]) - 0x100;
                      dVar4 = (y * 0x100 + comparePixelRGBA8::s_offsets[v][1]) - 0x100;
                      iVar3 = ConstPixelBufferAccess::getWidth(reference);
                      bVar1 = de::inBounds<int>(dVar2,0,(iVar3 + -1) * 0x100);
                      if (bVar1) {
                        iVar3 = ConstPixelBufferAccess::getHeight(reference);
                        bVar1 = de::inBounds<int>(dVar4,0,(iVar3 + -1) * 0x100);
                        if (bVar1) {
                          RVar5 = bilinearSampleRGBA8(reference,dVar2,dVar4);
                          bVar1 = compareThreshold(a,RVar5,threshold);
                          if (bVar1) {
                            return true;
                          }
                        }
                      }
                      v = v + 1;
                    } while( true );
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool comparePixelRGBA8 (const ConstPixelBufferAccess& reference, const ConstPixelBufferAccess& result, const RGBA threshold, int x, int y)
{
	const RGBA resPix = readRGBA8(result, (deUint32)x, (deUint32)y);

	// Step 1: Compare result pixel to 3x3 neighborhood pixels in reference.
	{
		const deUint32	x0		= (deUint32)de::max(x-1, 0);
		const deUint32	x1		= (deUint32)x;
		const deUint32	x2		= (deUint32)de::min(x+1, reference.getWidth()-1);
		const deUint32	y0		= (deUint32)de::max(y-1, 0);
		const deUint32	y1		= (deUint32)y;
		const deUint32	y2		= (deUint32)de::min(y+1, reference.getHeight()-1);

		if (compareThreshold(resPix, readRGBA8(reference, x1, y1), threshold) ||
			compareThreshold(resPix, readRGBA8(reference, x0, y1), threshold) ||
			compareThreshold(resPix, readRGBA8(reference, x2, y1), threshold) ||
			compareThreshold(resPix, readRGBA8(reference, x0, y0), threshold) ||
			compareThreshold(resPix, readRGBA8(reference, x1, y0), threshold) ||
			compareThreshold(resPix, readRGBA8(reference, x2, y0), threshold) ||
			compareThreshold(resPix, readRGBA8(reference, x0, y2), threshold) ||
			compareThreshold(resPix, readRGBA8(reference, x1, y2), threshold) ||
			compareThreshold(resPix, readRGBA8(reference, x2, y2), threshold))
			return true;
	}

	// Step 2: Compare using bilinear sampling.
	{
		// \todo [pyry] Optimize sample positions!
		static const deUint32 s_offsets[][2] =
		{
			{ 226, 186 },
			{ 335, 235 },
			{ 279, 334 },
			{ 178, 272 },
			{ 112, 202 },
			{ 306, 117 },
			{ 396, 299 },
			{ 206, 382 },
			{ 146,  96 },
			{ 423, 155 },
			{ 361, 412 },
			{  84, 339 },
			{  48, 130 },
			{ 367,  43 },
			{ 455, 367 },
			{ 105, 439 },
			{  83,  46 },
			{ 217,  24 },
			{ 461,  71 },
			{ 450, 459 },
			{ 239, 469 },
			{  67, 267 },
			{ 459, 255 },
			{  13, 416 },
			{  10, 192 },
			{ 141, 502 },
			{ 503, 304 },
			{ 380, 506 }
		};

		for (int sampleNdx = 0; sampleNdx < DE_LENGTH_OF_ARRAY(s_offsets); sampleNdx++)
		{
			const int u = (x<<NUM_SUBPIXEL_BITS) + (int)s_offsets[sampleNdx][0] - (1<<NUM_SUBPIXEL_BITS);
			const int v = (y<<NUM_SUBPIXEL_BITS) + (int)s_offsets[sampleNdx][1] - (1<<NUM_SUBPIXEL_BITS);

			if (!de::inBounds(u, 0, (reference.getWidth()-1)<<NUM_SUBPIXEL_BITS) ||
				!de::inBounds(v, 0, (reference.getHeight()-1)<<NUM_SUBPIXEL_BITS))
				continue;

			if (compareThreshold(resPix, bilinearSampleRGBA8(reference, (deUint32)u, (deUint32)v), threshold))
				return true;
		}
	}

	return false;
}